

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O1

void BinarySink_put_mp_ssh2_from_string(BinarySink *bs,ptrlen str)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long val;
  void *data;
  
  sVar3 = str.len;
  data = str.ptr;
  if (sVar3 == 0) {
    val = 0;
  }
  else {
    sVar2 = 0;
    do {
      pcVar1 = (char *)((long)data + sVar2);
      if (*pcVar1 != '\0') {
        val = sVar3 - sVar2;
        data = (void *)((long)data + sVar2);
        if (-1 < *pcVar1) goto LAB_00115617;
        BinarySink_put_uint32(bs->binarysink_,(sVar3 - sVar2) + 1);
        BinarySink_put_byte(bs->binarysink_,'\0');
        goto LAB_00115629;
      }
      sVar2 = sVar2 + 1;
    } while (sVar3 != sVar2);
    val = 0;
    data = (void *)((long)data + sVar3);
  }
LAB_00115617:
  BinarySink_put_uint32(bs->binarysink_,val);
LAB_00115629:
  BinarySink_put_data(bs->binarysink_,data,val);
  return;
}

Assistant:

void BinarySink_put_mp_ssh2_from_string(BinarySink *bs, ptrlen str)
{
    const unsigned char *bytes = (const unsigned char *)str.ptr;
    size_t nbytes = str.len;
    while (nbytes > 0 && bytes[0] == 0) {
        nbytes--;
        bytes++;
    }
    if (nbytes > 0 && bytes[0] & 0x80) {
        put_uint32(bs, nbytes + 1);
        put_byte(bs, 0);
    } else {
        put_uint32(bs, nbytes);
    }
    put_data(bs, bytes, nbytes);
}